

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O1

void __thiscall
cppnet::Dispatcher::Dispatcher
          (Dispatcher *this,shared_ptr<cppnet::CppNetBase> *base,uint32_t thread_num,
          uint32_t base_id)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  (this->super_Thread)._stop._M_base._M_i = true;
  (this->super_Thread)._thread._M_t.
  super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  (this->super_enable_shared_from_this<cppnet::Dispatcher>)._M_weak_this.
  super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<cppnet::Dispatcher>)._M_weak_this.
  super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__Dispatcher_00127ee0;
  this->_cur_utc_time = 0;
  (this->_timer_id_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_timer_id_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_timer_id_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_timer_id_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_timer_id_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->_timer_id_creater = 0;
  (this->_task_list_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_task_list_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_task_list_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_task_list_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_task_list_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->_task_list).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_task_list).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_task_list).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_local_thread_id)._M_thread = 0;
  (this->_timer).super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_timer).super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_event_actions).super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->_event_actions).super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_cppnet_base).super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (base->super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (base->super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->_cppnet_base).super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
    }
  }
  MakeTimer1Min();
  p_Var1 = (this->_timer).super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->_timer).super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
  (this->_timer).super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_20;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  MakeEventActions();
  p_Var1 = (this->_event_actions).
           super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->_event_actions).super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->_event_actions).super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (this->_event_actions).
           super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_EventActions[2])(peVar2,0);
  (*(this->super_Thread)._vptr_Thread[2])(this);
  return;
}

Assistant:

Dispatcher::Dispatcher(std::shared_ptr<CppNetBase> base, uint32_t thread_num, uint32_t base_id):
    _cur_utc_time(0),
    _timer_id_creater(0),
    _cppnet_base(base) {

    _timer = MakeTimer1Min();

    _event_actions = MakeEventActions();
    _event_actions->Init();

    // start thread
    Start();
}